

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_strconv.cpp
# Opt level: O3

optional<std::basic_string_view<char,_std::char_traits<char>_>_> * __thiscall
ritobin::strconv_impl::StringIterator::match_str
          (optional<std::basic_string_view<char,_std::char_traits<char>_>_> *__return_storage_ptr__,
          StringIterator *this,string_view what)

{
  ulong uVar1;
  char *__s1;
  bool bVar2;
  int iVar3;
  ulong __n;
  
  __n = what._M_len;
  uVar1 = (this->data_)._M_len;
  if ((uVar1 < __n) ||
     ((__s1 = (this->data_)._M_str, __n != 0 && (iVar3 = bcmp(__s1,what._M_str,__n), iVar3 != 0))))
  {
    bVar2 = false;
  }
  else {
    (this->data_)._M_str = __s1 + __n;
    (this->data_)._M_len = uVar1 - __n;
    (__return_storage_ptr__->
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_payload._M_value._M_len = __n;
    (__return_storage_ptr__->
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_payload._M_value._M_str = what._M_str;
    bVar2 = true;
  }
  (__return_storage_ptr__->
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_engaged = bVar2;
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string_view> match_str(std::string_view what) noexcept {
            if (data_.starts_with(what)) {
                data_.remove_prefix(what.size());
                return what;
            } else {
                return std::nullopt;
            }
        }